

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorHori.cpp
# Opt level: O2

void __thiscall VECTOR_HORI_VERT::VectorHori::Output(VectorHori *this)

{
  char cVar1;
  uint uVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  uint i;
  ulong uVar4;
  string local_280;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ofstream fil;
  
  std::ofstream::ofstream(&fil);
  Vector::get_filename_abi_cxx11_(&local_280,&this->super_Vector);
  std::ofstream::open((char *)&fil,(_Ios_Openmode)local_280._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_280);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&fil,(this->super_Vector).znak);
    std::operator<<(poVar3,"*");
    uVar4 = 0;
    while( true ) {
      uVar2 = Vector::get_length(&this->super_Vector);
      if (uVar2 <= uVar4) break;
      poVar3 = (ostream *)
               std::ostream::operator<<((ostream *)&fil,(this->super_Vector).vector_[uVar4]);
      std::operator<<(poVar3,' ');
      uVar4 = uVar4 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&fil);
    std::ofstream::close();
    std::ofstream::~ofstream(&fil);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  Vector::get_filename_abi_cxx11_(&local_260,&this->super_Vector);
  std::operator+(&local_240,"Error! Cannot open file ",&local_260);
  std::operator+(&local_280,&local_240,"!\n");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_280);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void VectorHori::Output() const {
    std::ofstream fil;
    fil.open(this->get_filename().c_str(), std::ios_base::app);
    if (!fil.is_open()) {
      throw std::invalid_argument("Error! Cannot open file " + this->get_filename() + "!\n");
    }
    fil << this-> znak << "*";
    for (unsigned int i = 0; i < this->get_length(); i++) {
      fil << this->vector_[i] << ' ';
    }
    fil << std::endl;

    fil.close();
  }